

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lengauer_tarjan.cpp
# Opt level: O0

void addToBucket(int buckIdx,int element)

{
  value_type vVar1;
  reference pvVar2;
  int in_ESI;
  int in_EDI;
  int old;
  
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&bucket,(long)in_EDI);
  if (*pvVar2 == -1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&bucket,(long)in_EDI);
    *pvVar2 = in_ESI;
  }
  else {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&bucket,(long)in_EDI);
    vVar1 = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&bucket,(long)in_EDI);
    *pvVar2 = in_ESI;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&bucket,(long)in_ESI);
    *pvVar2 = vVar1;
  }
  return;
}

Assistant:

void addToBucket(int buckIdx, int element) {
	if (bucket[buckIdx] == -1) {
		bucket[buckIdx] = element;
	} else {
		const int old = bucket[buckIdx];
		bucket[buckIdx] = element;
		bucket[element] = old;
	}
}